

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void PushWarnings(vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings,UniValue *obj)

{
  long lVar1;
  bool bVar2;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *in_stack_ffffffffffffff38;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff78;
  UniValue *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<bilingual_str,_std::allocator<bilingual_str>_>::empty
                    (in_stack_ffffffffffffff48);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
               (allocator<char> *)in_stack_ffffffffffffff78);
    BilingualStringsToUniValue
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffff80);
    UniValue::pushKV(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RDI);
    UniValue::~UniValue(in_stack_ffffffffffffff38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff38);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PushWarnings(const std::vector<bilingual_str>& warnings, UniValue& obj)
{
    if (warnings.empty()) return;
    obj.pushKV("warnings", BilingualStringsToUniValue(warnings));
}